

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void __thiscall mocker::UnresolvableSymbol::~UnresolvableSymbol(UnresolvableSymbol *this)

{
  UnresolvableSymbol *this_local;
  
  ~UnresolvableSymbol(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

UnresolvableSymbol(const Position &beg, const Position &end,
                     const std::string &symName)
      : CompileError(beg, end) {
    msg = std::string(CompileError::what()) + ". Symbol: " + symName;
  }